

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O3

VFSNode __thiscall VFS::CVFS::CVFSDir::Search(CVFSDir *this,string *Name)

{
  pthread_mutex_t *__mutex;
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  size_t sVar5;
  undefined8 uVar6;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pthread_mutex_t *unaff_RBP;
  bool bVar7;
  VFSNode VVar8;
  pthread_mutex_t *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  __mutex = (pthread_mutex_t *)(Name + 2);
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    (this->super_CVFSNode)._vptr_CVFSNode = (_func_int **)0x0;
    (this->super_CVFSNode).m_Name._M_dataplus._M_p = (pointer)0x0;
    if (Name[3]._M_string_length != Name[3].field_2._M_allocated_capacity) {
      sVar5 = Search((CVFSDir *)Name,in_RDX,0,
                     ((long)(Name[3].field_2._M_allocated_capacity - Name[3]._M_string_length) >> 4)
                     - 1);
      lVar2 = *(long *)(Name[3]._M_string_length + sVar5 * 0x10);
      unaff_RBP = (pthread_mutex_t *)(lVar2 + 0x40);
      iVar4 = pthread_mutex_lock(unaff_RBP);
      local_58 = __mutex;
      if (iVar4 != 0) goto LAB_0010a755;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(lVar2 + 8),
                 *(long *)(lVar2 + 0x10) + *(long *)(lVar2 + 8));
      pthread_mutex_unlock(unaff_RBP);
      plVar3 = local_50;
      if (local_48 == in_RDX->_M_string_length) {
        if (local_48 == 0) {
          bVar7 = true;
        }
        else {
          iVar4 = bcmp(local_50,(in_RDX->_M_dataplus)._M_p,local_48);
          bVar7 = iVar4 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (plVar3 != local_40) {
        operator_delete(plVar3,local_40[0] + 1);
      }
      if (bVar7) {
        puVar1 = (undefined8 *)(Name[3]._M_string_length + sVar5 * 0x10);
        (this->super_CVFSNode)._vptr_CVFSNode = (_func_int **)*puVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_CVFSNode).m_Name,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
      }
    }
    pthread_mutex_unlock(__mutex);
    VVar8.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    VVar8.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &this->super_CVFSNode;
    return (VFSNode)VVar8.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>;
  }
  iVar4 = std::__throw_system_error(iVar4);
LAB_0010a755:
  uVar6 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock(unaff_RBP);
  pthread_mutex_unlock(local_58);
  _Unwind_Resume(uVar6);
}

Assistant:

VFSNode Search(const std::string &Name)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        VFSNode Ret;

                        if(!m_Childs.empty())
                        {
                            size_t Pos = Search(Name, 0, m_Childs.size() - 1);
                            if(m_Childs[Pos]->Name() == Name)
                                Ret = m_Childs[Pos];
                        }

                        return Ret;
                    }